

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

void __thiscall glslang::TProgram::TProgram(TProgram *this)

{
  long lVar1;
  TPoolAllocator *this_00;
  TInfoSink *pTVar2;
  long lVar3;
  
  this->_vptr_TProgram = (_func_int **)&PTR__TProgram_00923028;
  lVar3 = 0;
  do {
    lVar1 = (long)&this->stages[0].
                   super__List_base<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>._M_impl
                   ._M_node.super__List_node_base._M_next + lVar3;
    *(long *)((long)&this->stages[0].
                     super__List_base<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>.
                     _M_impl._M_node.super__List_node_base._M_prev + lVar3) = lVar1;
    *(long *)((long)&this->stages[0].
                     super__List_base<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>.
                     _M_impl._M_node.super__List_node_base._M_next + lVar3) = lVar1;
    *(undefined8 *)
     ((long)&this->stages[0].
             super__List_base<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>._M_impl.
             _M_node._M_size + lVar3) = 0;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x150);
  this->reflection = (TReflection *)0x0;
  this->linked = false;
  this_00 = (TPoolAllocator *)operator_new(0x60);
  TPoolAllocator::TPoolAllocator(this_00,0x2000,0x10);
  this->pool = this_00;
  pTVar2 = (TInfoSink *)operator_new(0x60);
  (pTVar2->info).sink._M_dataplus._M_p = (pointer)&(pTVar2->info).sink.field_2;
  (pTVar2->info).sink._M_string_length = 0;
  (pTVar2->info).sink.field_2._M_local_buf[0] = '\0';
  (pTVar2->info).outputStream = 4;
  (pTVar2->info).shaderFileName = (char *)0x0;
  (pTVar2->debug).sink._M_dataplus._M_p = (pointer)&(pTVar2->debug).sink.field_2;
  (pTVar2->debug).sink._M_string_length = 0;
  (pTVar2->debug).sink.field_2._M_local_buf[0] = '\0';
  (pTVar2->debug).outputStream = 4;
  (pTVar2->debug).shaderFileName = (char *)0x0;
  this->infoSink = pTVar2;
  *(undefined8 *)((long)this->intermediate + 0x6e) = 0;
  this->newedIntermediate[6] = false;
  this->newedIntermediate[7] = false;
  this->newedIntermediate[8] = false;
  this->newedIntermediate[9] = false;
  this->newedIntermediate[10] = false;
  this->newedIntermediate[0xb] = false;
  this->newedIntermediate[0xc] = false;
  this->newedIntermediate[0xd] = false;
  this->intermediate[0xc] = (TIntermediate *)0x0;
  this->intermediate[0xd] = (TIntermediate *)0x0;
  this->intermediate[10] = (TIntermediate *)0x0;
  this->intermediate[0xb] = (TIntermediate *)0x0;
  this->intermediate[8] = (TIntermediate *)0x0;
  this->intermediate[9] = (TIntermediate *)0x0;
  this->intermediate[6] = (TIntermediate *)0x0;
  this->intermediate[7] = (TIntermediate *)0x0;
  this->intermediate[4] = (TIntermediate *)0x0;
  this->intermediate[5] = (TIntermediate *)0x0;
  this->intermediate[2] = (TIntermediate *)0x0;
  this->intermediate[3] = (TIntermediate *)0x0;
  this->intermediate[0] = (TIntermediate *)0x0;
  this->intermediate[1] = (TIntermediate *)0x0;
  return;
}

Assistant:

TProgram::TProgram() : reflection(nullptr), linked(false)
{
    pool = new TPoolAllocator;
    infoSink = new TInfoSink;
    for (int s = 0; s < EShLangCount; ++s) {
        intermediate[s] = nullptr;
        newedIntermediate[s] = false;
    }
}